

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_value.hpp
# Opt level: O2

void __thiscall
chaiscript::Boxed_Value::Boxed_Value<std::__cxx11::string&,void>
          (Boxed_Value *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t,
          bool t_return_value)

{
  string asStack_38 [32];
  
  std::__cxx11::string::string(asStack_38,(string *)t);
  Object_Data::get<std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
             SUB81(asStack_38,0));
  std::__cxx11::string::~string(asStack_38);
  return;
}

Assistant:

explicit Boxed_Value(T &&t, bool t_return_value = false)
          : m_data(Object_Data::get(std::forward<T>(t), t_return_value))
        {
        }